

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OPL3.cpp
# Opt level: O1

void __thiscall
EnvelopeGenerator::setActualReleaseRate
          (EnvelopeGenerator *this,int releaseRate,int ksr,int keyScaleNumber)

{
  int iVar1;
  int iVar2;
  
  iVar2 = releaseRate * 4 +
          *(int *)(EnvelopeGeneratorData::rateOffset + (long)keyScaleNumber * 4 + (long)ksr * 0x40);
  iVar1 = 0x3f;
  if (iVar2 < 0x3f) {
    iVar1 = iVar2;
  }
  this->actualReleaseRate = iVar1;
  this->dBreleaseIncrement =
       0.19193871378214752 /
       *(double *)(EnvelopeGeneratorData::decayAndReleaseTimeValuesTable + (long)iVar1 * 0x10 + 8);
  return;
}

Assistant:

int EnvelopeGenerator::calculateActualRate(int rate, int ksr, int keyScaleNumber) {
	int rof = EnvelopeGeneratorData::rateOffset[ksr][keyScaleNumber];
	int actualRate = rate*4 + rof;
	// If, as an example at the maximum, rate is 15 and the rate offset is 15, 
	// the value would
	// be 75, but the maximum allowed is 63:
	if(actualRate > 63) actualRate = 63;
	return actualRate;
}